

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilities.cpp
# Opt level: O0

uint64_t libcellml::ulpsDistance(double a,double b)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  uint64_t local_38;
  uint64_t distance;
  uint64_t ib;
  uint64_t ia;
  double b_local;
  double a_local;
  
  uVar1 = std::isnan(a);
  if (((uVar1 & 1) == 0) && (uVar1 = std::isnan(b), (uVar1 & 1) == 0)) {
    iVar2 = std::isinf(a);
    iVar3 = std::isinf(b);
    if (((byte)iVar2 & 1) != ((byte)iVar3 & 1)) {
      return 0xffffffffffffffff;
    }
    if ((ulong)a < (ulong)b) {
      lVar4 = (long)b + ((ulong)a ^ 0xffffffffffffffff);
    }
    else {
      lVar4 = (long)a + ((ulong)b ^ 0xffffffffffffffff);
    }
    local_38 = lVar4 + 1;
    return local_38;
  }
  return 0xffffffffffffffff;
}

Assistant:

uint64_t ulpsDistance(double a, double b)
{
    static const auto max = std::numeric_limits<uint64_t>::max();

    // Max distance for NaN.
    if (std::isnan(a) || std::isnan(b)) {
        return max;
    }

    // If one's infinite and they're not equal, max distance.
    if (std::isinf(a) != std::isinf(b)) {
        return max;
    }

    static const int SIZE_OF_DOUBLE = sizeof(double);

    uint64_t ia;
    uint64_t ib;
    memcpy(&ia, &a, SIZE_OF_DOUBLE);
    memcpy(&ib, &b, SIZE_OF_DOUBLE);

    // Return the absolute value of the distance in ULPs.
    uint64_t distance = max;
    if (ia < ib) {
        distance = ib + ~ia + 1;
    } else {
        distance = ia + ~ib + 1;
    }
    return distance;
}